

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   (string *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_00000010;
  string *in_stack_00000018;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  string local_58 [56];
  undefined8 local_20;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *local_10;
  
  local_20 = 1;
  local_10 = in_RSI;
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0x2a39e8d);
  ::std::__cxx11::string::string(local_58,in_RDX);
  ConstructMessageRecursive<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008);
  ::std::__cxx11::string::~string(local_58);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(local_10);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}